

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b4327e::X509Test_NoBasicConstraintsNetscapeCA_Test::TestBody
          (X509Test_NoBasicConstraintsNetscapeCA_Test *this)

{
  void *pvVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  AssertionResult gtest_ar_;
  UniquePtr<X509> leaf;
  UniquePtr<X509> intermediate;
  UniquePtr<X509> root;
  AssertionResult gtest_ar;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  pointer local_d8;
  allocator_type local_ca;
  allocator_type local_c9;
  string local_c8;
  AssertHelper local_a8 [2];
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_98;
  _Head_base<0UL,_x509_st_*,_false> local_78;
  _Head_base<0UL,_x509_st_*,_false> local_70;
  _Head_base<0UL,_x509_st_*,_false> local_68;
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  int local_50;
  int local_4c;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  _Head_base<0UL,_x509_st_*,_false> local_28;
  x509_st *local_20;
  
  CertFromPEM((anon_unknown_dwarf_b4327e *)&local_68,
              "\n-----BEGIN CERTIFICATE-----\nMIICTTCCAbagAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwKzEXMBUGA1UE\nChMOQm9yaW5nU1NMIFRlc3QxEDAOBgNVBAMTB1Jvb3QgQ0EwHhcNMTUwMTAxMDAw\nMDAwWhcNMjUwMTAxMDAwMDAwWjArMRcwFQYDVQQKEw5Cb3JpbmdTU0wgVGVzdDEQ\nMA4GA1UEAxMHUm9vdCBDQTCBnzANBgkqhkiG9w0BAQEFAAOBjQAwgYkCgYEA6Q5/\nEQzmWuaGg3D2UQcuAngR9bIkkjjuJmICx5TxPqF3asCP1SJotl3iTNrghRE1wpJy\nSY2BtIiXa7f8skRb2U0GcPkMxo/ps9+jaoRsQ1m+nbLQdpvD1/qZWcO45fNTA71J\n1rPMokP+rcILuQG4VimUAySnDSghKamulFtK+Z8CAwEAAaN6MHgwDgYDVR0PAQH/\nBAQDAgIEMB0GA1UdJQQWMBQGCCsGAQUFBwMBBggrBgEFBQcDAjAPBgNVHRMBAf8E\nBTADAQH/MBkGA1UdDgQSBBBAN9cB+0AvuBx+VAQnjFkBMBsGA1UdIwQUMBKAEEA3\n1wH7QC+4HH5UBCeMWQEwDQYJKoZIhvcNAQELBQADgYEAc4N6hTE62/3gwg+kyc2f\nc/Jj1mHrOt+0NRaBnmvbmNpsEjHS96Ef4Wt/ZlPXPkkv1C1VosJnOIMF3Q522wRH\nbqaxARldS12VAa3gcWisDWD+SqSyDxjyojz0XDiJkTrFuCTCUiZO+1GLB7SO10Ms\nd5YVX0c90VMnUhF/dlrqS9U=\n-----END CERTIFICATE-----\n"
             );
  CertFromPEM((anon_unknown_dwarf_b4327e *)&local_70,
              "\n-----BEGIN CERTIFICATE-----\nMIIBuDCCASGgAwIBAgIBAjANBgkqhkiG9w0BAQsFADArMRcwFQYDVQQKEw5Cb3Jp\nbmdTU0wgVGVzdDEQMA4GA1UEAxMHUm9vdCBDQTAgFw0wMDAxMDEwMDAwMDBaGA8y\nMDk5MDEwMTAwMDAwMFowKjEoMCYGA1UEAxMfTm8gQmFzaWMgQ29uc3RyYWludHMg\nKE5ldHNjYXBlKTBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABCeMbmCaOtMzXBqi\nPrCdNOH23CkaawUA+pAezitAN4RXS1O2CGK5sJjGPVVeogROU8G7/b+mU+ciZIzH\n1PP8FJKjMjAwMBsGA1UdIwQUMBKAEEA31wH7QC+4HH5UBCeMWQEwEQYJYIZIAYb4\nQgEBBAQDAgIEMA0GCSqGSIb3DQEBCwUAA4GBAAgNWjh7cfBTClTAk+Ml//5xb9Ju\ntkBhG6Rm+kkMD+qiSMO6t7xS7CsA0+jIBjkdEYaLZ3oxtQCBdZsVNxUvRxZ0AUfF\nG3DtRFTsrI1f7IQhpMuqEMF4shPW+5x54hrq0Fo6xMs6XoinJZcTUaaB8EeXRF6M\nP9p6HuyLrmn0c/F0\n-----END CERTIFICATE-----\n"
             );
  CertFromPEM((anon_unknown_dwarf_b4327e *)&local_78,
              "\n-----BEGIN CERTIFICATE-----\nMIIBXDCCAQKgAwIBAgIBAzAKBggqhkjOPQQDAjAqMSgwJgYDVQQDEx9ObyBCYXNp\nYyBDb25zdHJhaW50cyAoTmV0c2NhcGUpMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkw\nMTAxMDAwMDAwWjAxMS8wLQYDVQQDEyZMZWFmIGZyb20gQ0Egd2l0aCBubyBCYXNp\nYyBDb25zdHJhaW50czBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABDlJKolDu3R2\ntPqSDycr0QJcWhxdBv76V0EEVflcHRxED6vAioTEcnQszt1OfKtBZvjlo0yp6i6Q\nDaYit0ZInmWjEDAOMAwGA1UdEwEB/wQCMAAwCgYIKoZIzj0EAwIDSAAwRQIhAJsh\naZL6BHeEfoUBj1oZ2Ln91qzj3UCVMJ+vrmwAFdYyAiA3wp2JphgchvmoUFuzPXwj\nXyPwWPbymSTpzKhB4xB7qQ==\n-----END CERTIFICATE-----\n"
             );
  local_e8[0] = (internal)(local_68._M_head_impl != (x509_st *)0x0);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68._M_head_impl == (x509_st *)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_e8,(AssertionResult *)0x5c83c3,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xb8c,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
LAB_003c9c21:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_e0;
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl
                  .super__Vector_impl_data._M_start)->sig_alg)();
    }
    local_58 = local_e0;
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_003c9cc4;
  }
  else {
    local_e8[0] = (internal)(local_70._M_head_impl != (x509_st *)0x0);
    local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_70._M_head_impl == (x509_st *)0x0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,(AssertionResult *)0x5a5ffb,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xb8d,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
      goto LAB_003c9c21;
    }
    local_e8[0] = (internal)(local_78._M_head_impl != (X509 *)0x0);
    local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_78._M_head_impl == (X509 *)0x0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_e8,(AssertionResult *)0x5a6039,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xb8e,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
      goto LAB_003c9c21;
    }
    local_50 = 0x18;
    local_20 = local_68._M_head_impl;
    __l._M_len = 1;
    __l._M_array = &local_20;
    std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
              ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c8,__l,&local_c9);
    local_28._M_head_impl = local_70._M_head_impl;
    __l_00._M_len = 1;
    __l_00._M_array = &local_28._M_head_impl;
    std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
              ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_e8,__l_00,&local_ca);
    local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_38 = (code *)0x0;
    uStack_30 = 0;
    local_4c = Verify(local_78._M_head_impl,
                      (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c8,
                      (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_e8,&local_98,0,
                      (function<void_(x509_store_ctx_st_*)> *)&local_48);
    testing::internal::CmpHelperEQ<int,int>
              (local_60,"24","Verify(leaf.get(), {root.get()}, {intermediate.get()}, {}, 0)",
               &local_50,&local_4c);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pvVar1 = (void *)CONCAT71(local_e8._1_7_,local_e8[0]);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_d8 - (long)pvVar1);
    }
    if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
      operator_delete(local_c8._M_dataplus._M_p,
                      local_c8.field_2._M_allocated_capacity - (long)local_c8._M_dataplus._M_p);
    }
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_58->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xb93,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
      if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
      }
    }
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_003c9cc4;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_58;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_58);
LAB_003c9cc4:
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_78);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_70);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_68);
  return;
}

Assistant:

TEST(X509Test, NoBasicConstraintsNetscapeCA) {
  bssl::UniquePtr<X509> root(CertFromPEM(kSANTypesRoot));
  bssl::UniquePtr<X509> intermediate(
      CertFromPEM(kNoBasicConstraintsNetscapeCAIntermediate));
  bssl::UniquePtr<X509> leaf(CertFromPEM(kNoBasicConstraintsNetscapeCALeaf));

  ASSERT_TRUE(root);
  ASSERT_TRUE(intermediate);
  ASSERT_TRUE(leaf);

  // The intermediate has a Netscape certificate type of "SSL CA", but is not
  // marked as a CA in the basicConstraints.
  EXPECT_EQ(X509_V_ERR_INVALID_CA,
            Verify(leaf.get(), {root.get()}, {intermediate.get()}, {}, 0));
}